

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

bool __thiscall
udpdiscovery::impl::PeerEnv::Start(PeerEnv *this,PeerParameters *parameters,string *user_data)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint __hostlong;
  ostream *poVar4;
  undefined1 local_4c [8];
  sockaddr_in addr;
  ip_mreq mreq;
  int reuse_port;
  int reuse_addr;
  int value;
  string *user_data_local;
  PeerParameters *parameters_local;
  PeerEnv *this_local;
  
  _reuse_addr = user_data;
  user_data_local = (string *)parameters;
  parameters_local = (PeerParameters *)this;
  memcpy(&this->parameters_,parameters,0x30);
  std::__cxx11::string::operator=((string *)&this->user_data_,(string *)_reuse_addr);
  bVar1 = PeerParameters::can_use_broadcast(&this->parameters_);
  if ((bVar1) || (bVar1 = PeerParameters::can_use_multicast(&this->parameters_), bVar1)) {
    bVar1 = PeerParameters::can_discover(&this->parameters_);
    if ((bVar1) || (bVar1 = PeerParameters::can_be_discovered(&this->parameters_), bVar1)) {
      InitSockets();
      uVar2 = MakeRandomId();
      this->peer_id_ = uVar2;
      iVar3 = socket(2,2,0);
      this->sock_ = iVar3;
      if (this->sock_ == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"udpdiscovery::Peer can\'t create socket.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
      else {
        reuse_port = 1;
        setsockopt(this->sock_,1,6,&reuse_port,4);
        bVar1 = PeerParameters::can_discover(&this->parameters_);
        if (bVar1) {
          iVar3 = socket(2,2,0);
          this->binding_sock_ = iVar3;
          if (this->binding_sock_ == -1) {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "udpdiscovery::Peer can\'t create binding socket.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            CloseSocket(this->sock_);
            this->sock_ = -1;
          }
          mreq.imr_interface.s_addr = 1;
          setsockopt(this->binding_sock_,1,2,&mreq.imr_interface,4);
          mreq.imr_multiaddr.s_addr = 1;
          setsockopt(this->binding_sock_,1,0xf,&mreq,4);
          bVar1 = PeerParameters::can_use_multicast(&this->parameters_);
          if (bVar1) {
            __hostlong = PeerParameters::multicast_group_address(&this->parameters_);
            addr.sin_zero._0_4_ = htonl(__hostlong);
            addr.sin_zero[4] = '\0';
            addr.sin_zero[5] = '\0';
            addr.sin_zero[6] = '\0';
            addr.sin_zero[7] = '\0';
            setsockopt(this->binding_sock_,0,0x23,addr.sin_zero,8);
          }
          memset(local_4c,0,0x10);
          local_4c._0_2_ = 2;
          iVar3 = PeerParameters::port(&this->parameters_);
          local_4c._2_2_ = htons((uint16_t)iVar3);
          local_4c._4_4_ = htonl(0);
          iVar3 = bind(this->binding_sock_,(sockaddr *)local_4c,0x10);
          if (iVar3 < 0) {
            CloseSocket(this->binding_sock_);
            this->binding_sock_ = -1;
            CloseSocket(this->sock_);
            this->sock_ = -1;
            poVar4 = std::operator<<((ostream *)&std::cerr,"udpdiscovery::Peer can\'t bind socket.")
            ;
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            return false;
          }
          SetSocketTimeout(this->binding_sock_,0x14,1000);
        }
        this_local._7_1_ = true;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "udpdiscovery::Peer can\'t discover and can\'t be discovered.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "udpdiscovery::Peer can\'t use broadcast and can\'t use multicast.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Start(const PeerParameters& parameters, const std::string& user_data) {
    parameters_ = parameters;
    user_data_ = user_data;

    if (!parameters_.can_use_broadcast() && !parameters_.can_use_multicast()) {
      std::cerr
          << "udpdiscovery::Peer can't use broadcast and can't use multicast."
          << std::endl;
      return false;
    }

    if (!parameters_.can_discover() && !parameters_.can_be_discovered()) {
      std::cerr << "udpdiscovery::Peer can't discover and can't be discovered."
                << std::endl;
      return false;
    }

    InitSockets();

    peer_id_ = MakeRandomId();

    sock_ = socket(AF_INET, SOCK_DGRAM, 0);
    if (sock_ == kInvalidSocket) {
      std::cerr << "udpdiscovery::Peer can't create socket." << std::endl;
      return false;
    }

    {
      int value = 1;
      setsockopt(sock_, SOL_SOCKET, SO_BROADCAST, (const char*)&value,
                 sizeof(value));
    }

    if (parameters_.can_discover()) {
      binding_sock_ = socket(AF_INET, SOCK_DGRAM, 0);
      if (binding_sock_ == kInvalidSocket) {
        std::cerr << "udpdiscovery::Peer can't create binding socket."
                  << std::endl;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;
      }

      {
        int reuse_addr = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEADDR,
                   (const char*)&reuse_addr, sizeof(reuse_addr));
#ifdef SO_REUSEPORT
        int reuse_port = 1;
        setsockopt(binding_sock_, SOL_SOCKET, SO_REUSEPORT,
                   (const char*)&reuse_port, sizeof(reuse_port));
#endif
      }

      if (parameters_.can_use_multicast()) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr.s_addr =
            htonl(parameters_.multicast_group_address());
        mreq.imr_interface.s_addr = INADDR_ANY;
        setsockopt(binding_sock_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                   (const char*)&mreq, sizeof(mreq));
      }

      sockaddr_in addr;
      memset((char*)&addr, 0, sizeof(sockaddr_in));
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_ANY);

      if (bind(binding_sock_, (struct sockaddr*)&addr, sizeof(sockaddr_in)) <
          0) {
        CloseSocket(binding_sock_);
        binding_sock_ = kInvalidSocket;

        CloseSocket(sock_);
        sock_ = kInvalidSocket;

        std::cerr << "udpdiscovery::Peer can't bind socket." << std::endl;
        return false;
      }

      // TODO: Implement the way to unblock recvfrom without timeouting.
      SetSocketTimeout(binding_sock_, SO_RCVTIMEO, 1000);
    }

    return true;
  }